

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-packed.c++
# Opt level: O1

ssize_t __thiscall
capnp::_::PackedOutputStream::write(PackedOutputStream *this,int __fd,void *__buf,size_t __n)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  byte bVar11;
  ulong uVar12;
  long extraout_RDX;
  long extraout_RDX_00;
  byte *pbVar13;
  undefined4 in_register_00000034;
  ulong uVar14;
  byte *pbVar15;
  byte *pbVar16;
  ulong uVar17;
  byte *pbVar18;
  byte *pbVar19;
  byte *__src;
  byte slowBuffer [20];
  long local_60;
  byte local_48 [24];
  
  iVar10 = (*(this->inner->super_OutputStream)._vptr_OutputStream[4])();
  pbVar13 = (byte *)CONCAT44(extraout_var,iVar10);
  local_48[0] = 0;
  local_48[1] = 0;
  local_48[2] = 0;
  local_48[3] = 0;
  local_48[4] = 0;
  local_48[5] = 0;
  local_48[6] = 0;
  local_48[7] = 0;
  local_48[8] = 0;
  local_48[9] = 0;
  local_48[10] = 0;
  local_48[0xb] = 0;
  local_48[0xc] = 0;
  local_48[0xd] = 0;
  local_48[0xe] = 0;
  local_48[0xf] = 0;
  local_48[0x10] = 0;
  local_48[0x11] = 0;
  local_48[0x12] = 0;
  local_48[0x13] = 0;
  pbVar15 = pbVar13;
  if (0 < (long)__buf) {
    pbVar16 = (byte *)((long)__buf + (long)CONCAT44(in_register_00000034,__fd));
    pbVar18 = (byte *)CONCAT44(in_register_00000034,__fd);
    local_60 = extraout_RDX;
    do {
      pbVar19 = pbVar13;
      if ((long)(pbVar15 + (local_60 - (long)pbVar13)) < 10) {
        (*(this->inner->super_OutputStream)._vptr_OutputStream[2])
                  (this->inner,pbVar15,(long)pbVar13 - (long)pbVar15);
        local_60 = 0x14;
        pbVar19 = local_48;
        pbVar15 = pbVar19;
      }
      bVar11 = *pbVar18;
      uVar12 = (ulong)(bVar11 != 0);
      pbVar19[1] = bVar11;
      lVar8 = uVar12 + 1;
      bVar1 = pbVar18[1];
      uVar17 = (ulong)(bVar1 != 0);
      pbVar19[uVar12 + 1] = bVar1;
      lVar9 = uVar17 + lVar8;
      bVar2 = pbVar18[2];
      uVar12 = (ulong)(bVar2 != 0);
      pbVar19[uVar17 + lVar8] = bVar2;
      lVar8 = uVar12 + lVar9;
      bVar3 = pbVar18[3];
      uVar17 = (ulong)(bVar3 != 0);
      pbVar19[uVar12 + lVar9] = bVar3;
      lVar9 = uVar17 + lVar8;
      bVar4 = pbVar18[4];
      uVar14 = (ulong)(bVar4 != 0);
      pbVar19[uVar17 + lVar8] = bVar4;
      lVar8 = uVar14 + lVar9;
      bVar5 = pbVar18[5];
      uVar12 = (ulong)(bVar5 != 0);
      pbVar19[uVar14 + lVar9] = bVar5;
      lVar9 = uVar12 + lVar8;
      bVar6 = pbVar18[6];
      uVar17 = (ulong)(bVar6 != 0);
      pbVar19[uVar12 + lVar8] = bVar6;
      bVar7 = pbVar18[7];
      pbVar19[uVar17 + lVar9] = bVar7;
      pbVar13 = pbVar19 + (bVar7 != 0) + uVar17 + lVar9;
      __src = pbVar18 + 8;
      bVar11 = bVar11 != 0 | (bVar1 != 0) * '\x02';
      uVar12 = (ulong)bVar11;
      bVar11 = (bVar7 != 0) << 7 | (bVar6 != 0) << 6 |
               (bVar5 != 0) << 5 |
               (bVar4 != 0) << 4 | (bVar3 != 0) << 3 | (bVar2 != 0) << 2 | bVar11;
      *pbVar19 = bVar11;
      if (bVar11 == 0xff) {
        pbVar19 = __src;
        pbVar18 = pbVar18 + 0x800;
        if ((ulong)((long)pbVar16 - (long)__src) < 0x7f9) {
          pbVar18 = pbVar16;
        }
        do {
          if (pbVar18 <= pbVar19) goto LAB_001a7dbe;
          bVar11 = (pbVar19[6] == 0) +
                   (pbVar19[4] == 0) +
                   (pbVar19[2] == 0) + (pbVar19[1] == 0) + (*pbVar19 == 0) + (pbVar19[3] == 0) +
                   (pbVar19[5] == 0) + (pbVar19[7] == 0);
          uVar12 = 0;
          pbVar19 = pbVar19 + 8;
        } while (bVar11 < 2);
        uVar12 = (ulong)(bVar11 < 2) * 8;
        pbVar19 = pbVar19 + (uVar12 - 8);
LAB_001a7dbe:
        uVar17 = (long)pbVar19 - (long)__src;
        uVar14 = uVar17 & 0xffffffff;
        *pbVar13 = (byte)(uVar17 >> 3);
        pbVar13 = pbVar13 + 1;
        if ((long)(pbVar15 + (local_60 - (long)pbVar13)) < (long)uVar14) {
          (*(this->inner->super_OutputStream)._vptr_OutputStream[2])
                    (this->inner,pbVar15,(long)pbVar13 - (long)pbVar15,uVar12);
          (*(this->inner->super_OutputStream)._vptr_OutputStream[2])(this->inner,__src,uVar17);
          iVar10 = (*(this->inner->super_OutputStream)._vptr_OutputStream[4])();
          pbVar13 = (byte *)CONCAT44(extraout_var_00,iVar10);
          pbVar15 = pbVar13;
          __src = pbVar19;
          local_60 = extraout_RDX_00;
        }
        else {
          memcpy(pbVar13,__src,uVar14);
          pbVar13 = pbVar13 + uVar14;
          __src = pbVar19;
        }
      }
      else if (bVar11 == 0) {
        pbVar19 = __src;
        pbVar18 = pbVar18 + 0x800;
        if ((long)pbVar16 - (long)__src < 0x7f9) {
          pbVar18 = pbVar16;
        }
        for (; (pbVar19 < pbVar18 && (*(long *)pbVar19 == 0)); pbVar19 = pbVar19 + 8) {
        }
        *pbVar13 = (byte)((uint)((int)pbVar19 - (int)__src) >> 3);
        pbVar13 = pbVar13 + 1;
        __src = pbVar19;
      }
      pbVar18 = __src;
    } while (__src < pbVar16);
  }
  iVar10 = (*(this->inner->super_OutputStream)._vptr_OutputStream[2])
                     (this->inner,pbVar15,(long)pbVar13 - (long)pbVar15);
  return CONCAT44(extraout_var_01,iVar10);
}

Assistant:

void PackedOutputStream::write(kj::ArrayPtr<const byte> src) {
  kj::ArrayPtr<byte> buffer = inner.getWriteBuffer();
  byte slowBuffer[20]{};

  uint8_t* __restrict__ out = reinterpret_cast<uint8_t*>(buffer.begin());

  const uint8_t* __restrict__ in = src.begin();
  const uint8_t* const inEnd = src.end();

  while (in < inEnd) {
    if (reinterpret_cast<uint8_t*>(buffer.end()) - out < 10) {
      // Oops, we're out of space.  We need at least 10 bytes for the fast path, since we don't
      // bounds-check on every byte.

      // Write what we have so far.
      inner.write(buffer.first(out - reinterpret_cast<uint8_t*>(buffer.begin())));

      // Use a slow buffer into which we'll encode 10 to 20 bytes.  This should get us past the
      // output stream's buffer boundary.
      buffer = kj::arrayPtr(slowBuffer, sizeof(slowBuffer));
      out = reinterpret_cast<uint8_t*>(buffer.begin());
    }

    uint8_t* tagPos = out++;

#define HANDLE_BYTE(n) \
    uint8_t bit##n = *in != 0; \
    *out = *in; \
    out += bit##n; /* out only advances if the byte was non-zero */ \
    ++in

    HANDLE_BYTE(0);
    HANDLE_BYTE(1);
    HANDLE_BYTE(2);
    HANDLE_BYTE(3);
    HANDLE_BYTE(4);
    HANDLE_BYTE(5);
    HANDLE_BYTE(6);
    HANDLE_BYTE(7);
#undef HANDLE_BYTE

    uint8_t tag = (bit0 << 0) | (bit1 << 1) | (bit2 << 2) | (bit3 << 3)
                | (bit4 << 4) | (bit5 << 5) | (bit6 << 6) | (bit7 << 7);
    *tagPos = tag;

    if (tag == 0) {
      // An all-zero word is followed by a count of consecutive zero words (not including the
      // first one).

      // We can check a whole word at a time. (Here is where we use the assumption that
      // `src` is word-aligned.)
      const uint64_t* inWord = reinterpret_cast<const uint64_t*>(in);

      // The count must fit it 1 byte, so limit to 255 words.
      const uint64_t* limit = reinterpret_cast<const uint64_t*>(inEnd);
      if (limit - inWord > 255) {
        limit = inWord + 255;
      }

      while (inWord < limit && *inWord == 0) {
        ++inWord;
      }

      // Write the count.
      *out++ = inWord - reinterpret_cast<const uint64_t*>(in);

      // Advance input.
      in = reinterpret_cast<const uint8_t*>(inWord);

    } else if (tag == 0xffu) {
      // An all-nonzero word is followed by a count of consecutive uncompressed words, followed
      // by the uncompressed words themselves.

      // Count the number of consecutive words in the input which have no more than a single
      // zero-byte.  We look for at least two zeros because that's the point where our compression
      // scheme becomes a net win.
      // TODO(perf):  Maybe look for three zeros?  Compressing a two-zero word is a loss if the
      //   following word has no zeros.
      const uint8_t* runStart = in;

      const uint8_t* limit = inEnd;
      if ((size_t)(limit - in) > 255 * sizeof(word)) {
        limit = in + 255 * sizeof(word);
      }

      while (in < limit) {
        // Check eight input bytes for zeros.
        uint c = *in++ == 0;
        c += *in++ == 0;
        c += *in++ == 0;
        c += *in++ == 0;
        c += *in++ == 0;
        c += *in++ == 0;
        c += *in++ == 0;
        c += *in++ == 0;

        if (c >= 2) {
          // Un-read the word with multiple zeros, since we'll want to compress that one.
          in -= 8;
          break;
        }
      }

      // Write the count.
      uint count = in - runStart;
      *out++ = count / sizeof(word);

      if (count <= reinterpret_cast<uint8_t*>(buffer.end()) - out) {
        // There's enough space to memcpy.
        memcpy(out, runStart, count);
        out += count;
      } else {
        // Input overruns the output buffer.  We'll give it to the output stream in one chunk
        // and let it decide what to do.
        inner.write(buffer.first(reinterpret_cast<byte*>(out) - buffer.begin()));
        inner.write(kj::arrayPtr(runStart, in - runStart));
        buffer = inner.getWriteBuffer();
        out = reinterpret_cast<uint8_t*>(buffer.begin());
      }
    }
  }

  // Write whatever is left.
  inner.write(buffer.first(reinterpret_cast<byte*>(out) - buffer.begin()));
}